

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O3

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_send_op_base<std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
       ::do_perform(reactor_op *base)

{
  int __fd;
  uint uVar1;
  int iVar2;
  status sVar3;
  int *piVar4;
  ulong uVar5;
  error_category *peVar6;
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  bufs;
  msghdr local_478;
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  local_440;
  
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  ::buffer_sequence_adapter
            (&local_440,
             (prepared_buffers<std::experimental::net::v1::const_buffer,_64UL> *)
             &base[1].super_operation.func_);
  __fd = *(int *)&base[1].super_operation.next_;
  uVar1 = *(uint *)&base[5].perform_func_;
  piVar4 = __errno_location();
  do {
    *piVar4 = 0;
    local_478.msg_control = (void *)0x0;
    local_478.msg_controllen = 0;
    local_478.msg_name = (void *)0x0;
    local_478.msg_namelen = 0;
    local_478._12_4_ = 0;
    local_478.msg_flags = 0;
    local_478._52_4_ = 0;
    local_478.msg_iov = (iovec *)&local_440;
    local_478.msg_iovlen = (long)(int)local_440.count_;
    uVar5 = sendmsg(__fd,&local_478,uVar1 | 0x4000);
    iVar2 = *piVar4;
    peVar6 = (error_category *)::std::_V2::system_category();
    (base->ec_)._M_value = iVar2;
    (base->ec_)._M_cat = peVar6;
    if (-1 < (long)uVar5) {
      (base->ec_)._M_value = 0;
      (base->ec_)._M_cat = peVar6;
      goto LAB_00116e21;
    }
  } while (iVar2 == 4);
  if (iVar2 == 0xb) {
    sVar3 = not_done;
  }
  else {
    uVar5 = 0;
LAB_00116e21:
    base->bytes_transferred_ = uVar5;
    sVar3 = done;
    if (((ulong)base[1].super_operation.next_ & 0x1000000000) != 0) {
      sVar3 = (uVar5 < local_440.total_buffer_size_) + done;
    }
  }
  return sVar3;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    buffer_sequence_adapter<std::experimental::net::v1::const_buffer,
        ConstBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_send(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ < bufs.total_size())
          result = done_and_exhausted;

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }